

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::
build(BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BVHN<4> *this_00;
  long lVar3;
  void *pvVar4;
  MemoryMonitorInterface *pMVar5;
  undefined8 uVar6;
  Allocator alloc;
  mvector<PrimRef> *primrefarray_i;
  long *plVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  NodeRefPtr<4> root;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong numPrimRefs;
  ulong uVar13;
  ulong uVar14;
  anon_class_8_1_8991fb9c reportFinishedRange;
  anon_class_8_1_8991fb9c createLeaf;
  PrimInfo pinfo;
  Set local_1c4;
  Create local_1c3;
  Set local_1c2;
  Create local_1c1;
  mvector<PrimRef> *local_1c0;
  BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  CreateAlloc local_190;
  anon_class_8_1_8991fb9c local_188;
  anon_class_8_1_8991fb9c local_180;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  long lStack_130;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e8;
  long lStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  CreateAlloc *pCStack_a0;
  Create *local_98;
  Set *local_90;
  Create *local_88;
  Set *local_80;
  anon_class_8_1_8991fb9c *local_78;
  long local_70;
  anon_class_8_1_8991fb9c *local_68;
  undefined8 local_60;
  long local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  
  if (*(long *)(this + 0x70) != -1) {
    FastAllocator::unshare((FastAllocator *)(*(long *)(this + 0x10) + 0x78),(int)this + 0x20);
  }
  this_00 = *(BVHN<4> **)(this + 0x10);
  lVar9 = *(long *)(this + 0x18);
  numPrimRefs = *(long *)(lVar9 + 0x2b0) + *(long *)(lVar9 + 0x2c0) + *(long *)(lVar9 + 0x340);
  if (numPrimRefs == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    lVar9 = *(long *)(this + 0x38);
    pvVar4 = *(void **)(this + 0x40);
    if (pvVar4 != (void *)0x0) {
      if ((ulong)(lVar9 << 5) < 0x1c00000) {
        alignedFree(pvVar4);
      }
      else {
        os_free(pvVar4,lVar9 << 5,(bool)this[0x28]);
      }
    }
    if (lVar9 != 0) {
      (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),lVar9 * -0x20,1);
    }
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    *(undefined8 *)(this + 0x40) = 0;
    return;
  }
  local_128._0_8_ = &local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x01');
  *(undefined1 *)local_128._0_8_ = 0x34;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x1f8cf1e);
  paVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar7 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar7 == paVar11) {
    local_168._0_8_ = *(undefined8 *)paVar11;
    local_168._8_8_ = plVar7[3];
    local_178._0_8_ = &local_168;
  }
  else {
    local_168._0_8_ = *(undefined8 *)paVar11;
    local_178._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar7;
  }
  local_178._8_8_ = plVar7[1];
  *plVar7 = (long)paVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_c8._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_c8._8_8_ = plVar7[3];
    local_d8._0_8_ = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_d8._8_8_ = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1b0 = BVHN<4>::preBuild(this_00,(string *)&local_d8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_178._0_8_ != &local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_);
  }
  uVar10 = *(ulong *)(this + 0x38);
  uVar14 = uVar10;
  if ((uVar10 < numPrimRefs) && (uVar14 = numPrimRefs, uVar13 = uVar10, uVar10 != 0)) {
    do {
      uVar14 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
      uVar13 = uVar14;
    } while (uVar14 < numPrimRefs);
  }
  local_1b8 = this + 0x30;
  if (numPrimRefs < *(ulong *)(this + 0x30)) {
    *(ulong *)local_1b8 = numPrimRefs;
  }
  local_1c0 = (mvector<PrimRef> *)(this + 0x20);
  if (uVar10 == uVar14) {
    *(ulong *)local_1b8 = numPrimRefs;
    goto LAB_00bbc6a7;
  }
  pvVar4 = *(void **)(this + 0x40);
  uVar10 = uVar14 << 5;
  (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),uVar10,0);
  if (uVar10 < 0x1c00000) {
    pvVar8 = alignedMalloc(uVar10,0x20);
  }
  else {
    pvVar8 = os_malloc(uVar10,(bool *)(this + 0x28));
  }
  *(void **)(this + 0x40) = pvVar8;
  if (*(long *)(this + 0x30) == 0) {
    lVar9 = *(long *)(this + 0x38);
    if (pvVar4 != (void *)0x0) goto LAB_00bbc658;
  }
  else {
    lVar9 = 0x10;
    uVar10 = 0;
    do {
      lVar3 = *(long *)(this + 0x40);
      puVar1 = (undefined8 *)((long)pvVar4 + lVar9 + -0x10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)(lVar3 + -0x10 + lVar9);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      uVar6 = ((undefined8 *)((long)pvVar4 + lVar9))[1];
      puVar1 = (undefined8 *)(lVar3 + lVar9);
      *puVar1 = *(undefined8 *)((long)pvVar4 + lVar9);
      puVar1[1] = uVar6;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < *(ulong *)(this + 0x30));
    lVar9 = *(long *)(this + 0x38);
LAB_00bbc658:
    if ((ulong)(lVar9 << 5) < 0x1c00000) {
      alignedFree(pvVar4);
    }
    else {
      os_free(pvVar4,lVar9 << 5,(bool)this[0x28]);
    }
  }
  if (lVar9 != 0) {
    pMVar5 = (local_1c0->alloc).device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,lVar9 * -0x20,1);
  }
  *(ulong *)(this + 0x30) = numPrimRefs;
  *(ulong *)(this + 0x38) = uVar14;
LAB_00bbc6a7:
  primrefarray_i = local_1c0;
  sse2::createPrimRefArray
            ((PrimInfo *)&local_128.field_1,*(Scene **)(this + 0x18),MTY_CURVES,false,numPrimRefs,
             local_1c0,&((*(Scene **)(this + 0x18))->progressInterface).super_BuildProgressMonitor);
  uVar10 = lStack_e0 - local_e8;
  uVar14 = (ulong)((uint)uVar10 & 3);
  lVar9 = uVar14 * 0x19 + 0x16;
  if (uVar14 == 0) {
    lVar9 = 0;
  }
  FastAllocator::init_estimate
            ((FastAllocator *)(*(long *)(this + 0x10) + 0x78),
             (uVar10 >> 2) * 0x7a + (uVar10 * 0xe0 >> 4) + lVar9);
  *(undefined8 *)(this + 0x48) = 4;
  *(undefined8 *)(this + 0x50) = 0x28;
  for (lVar9 = 0; (4UL >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
  }
  *(long *)(this + 0x58) = lVar9;
  *(undefined8 *)(this + 0x60) = 4;
  uVar10 = 0xffffffffffffffff;
  if (999999 < numPrimRefs) {
    uVar10 = numPrimRefs / 1000;
  }
  *(undefined8 *)(this + 0x68) = 4;
  *(ulong *)(this + 0x70) = uVar10;
  local_78 = &local_180;
  local_68 = &local_188;
  local_190.super_Create.allocator = (Create)(*(long *)(this + 0x10) + 0x78);
  pCStack_a0 = &local_190;
  local_58 = *(long *)(this + 0x18);
  local_a8 = *(undefined8 *)(this + 0x40);
  local_70 = local_58 + 0x260;
  local_d8._0_8_ = *(undefined8 *)(this + 0x48);
  local_d8._8_8_ = *(undefined8 *)(this + 0x50);
  local_c8._M_allocated_capacity = *(undefined8 *)(this + 0x58);
  local_c8._8_8_ = *(undefined8 *)(this + 0x60);
  local_b8 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(this + 0x68);
  uStack_b0 = *(undefined8 *)(this + 0x70);
  local_98 = &local_1c1;
  local_90 = &local_1c2;
  local_88 = &local_1c3;
  local_80 = &local_1c4;
  local_178._0_8_ = local_128._0_8_;
  local_178._8_8_ = local_128._8_8_;
  local_168._0_8_ = local_118._0_8_;
  local_168._8_8_ = local_118._8_8_;
  local_158 = local_108;
  uStack_150 = uStack_100;
  local_148 = local_f8;
  uStack_140 = uStack_f0;
  local_138 = local_e8;
  lStack_130 = lStack_e0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  alloc.talloc1 = (ThreadLocal *)0x0;
  alloc.alloc = (FastAllocator *)0x0;
  alloc.talloc0 = (ThreadLocal *)0x0;
  local_188.this =
       (BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *)this;
  local_180.this =
       (BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *)this;
  local_60 = local_a8;
  local_50 = local_a8;
  local_48 = local_58;
  local_40 = local_a8;
  root = BVHBuilderHair::
         BuilderT<embree::NodeRefPtr<4>,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:82:36)>
         ::recurse((BuilderT<embree::NodeRefPtr<4>,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNode_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:82:36)>
                    *)&local_d8.field_1,1,(PrimInfoRange *)&local_178.field_1,alloc,true,false);
  local_d8._0_8_ = local_128._0_8_;
  local_d8._8_8_ = local_128._8_8_;
  local_c8._M_allocated_capacity = local_118._0_8_;
  local_c8._8_8_ = local_118._8_8_;
  local_b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_;
  uStack_b0 = local_128._8_8_;
  local_a8 = local_118._0_8_;
  pCStack_a0 = (CreateAlloc *)local_118._8_8_;
  BVHN<4>::set(*(BVHN<4> **)(this + 0x10),(NodeRef)root.ptr,(LBBox3fa *)&local_d8.field_1,
               lStack_e0 - local_e8);
  if (*(long *)(this + 0x70) != -1) {
    root.ptr = (size_t)primrefarray_i;
    FastAllocator::share((FastAllocator *)(*(long *)(this + 0x10) + 0x78),primrefarray_i);
  }
  if ((*(byte *)(*(long *)(this + 0x18) + 0x238) & 1) == 0) {
    lVar9 = *(long *)(this + 0x38);
    pvVar4 = *(void **)(this + 0x40);
    if (pvVar4 != (void *)0x0) {
      root.ptr = lVar9 << 5;
      if (root.ptr < (mvector<PrimRef> *)0x1c00000) {
        alignedFree(pvVar4);
      }
      else {
        os_free(pvVar4,root.ptr,(bool)this[0x28]);
      }
    }
    if (lVar9 != 0) {
      pMVar5 = (primrefarray_i->alloc).device;
      root.ptr = lVar9 * -0x20;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,root.ptr,1);
    }
    *(ulong *)local_1b8 = 0;
    *(ulong *)(local_1b8 + 8) = 0;
    *(ulong *)(local_1b8 + 0x10) = 0;
  }
  BVHN<4>::cleanup(*(BVHN<4> **)(this + 0x10),(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(*(BVHN<4> **)(this + 0x10),local_1b0);
  return;
}

Assistant:

void build() 
      {
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.unshare(prims);

        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,false);
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairBuilderSAH");

        /* create primref array */
        prims.resize(numPrimitives);
        const PrimInfo pinfo = createPrimRefArray(scene,Geometry::MTY_CURVES,false,numPrimitives,prims,scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.size()*sizeof(typename BVH::OBBNode)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.size());
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        
        /* builder settings */
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();
        settings.finished_range_threshold = numPrimitives/1000;
        if (settings.finished_range_threshold < 1000)
          settings.finished_range_threshold = inf;

        /* creates a leaf node */
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& set, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
          
          if (set.size() == 0)
            return BVH::emptyNode;

          const unsigned int geomID0 = prims[set.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeaf(bvh,prims,set,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeaf(bvh,prims,set,alloc);
          else
            return CurvePrimitive::createLeaf(bvh,prims,set,alloc);
        };
        
        auto reportFinishedRange = [&] (const range<size_t>& range) -> void
          {
            PrimRef* begin = prims.data()+range.begin();
            PrimRef* end   = prims.data()+range.end(); // FIXME: extended end for spatial split builder!!!!!
            size_t bytes = (size_t)end - (size_t)begin;
            bvh->alloc.addBlock(begin,bytes);
          };
          
        /* build hierarchy */
        typename BVH::NodeRef root = BVHBuilderHair::build<NodeRef>
          (typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNode::Create(),
           typename BVH::AABBNode::Set(),
           typename BVH::OBBNode::Create(),
           typename BVH::OBBNode::Set(),
           createLeaf,scene->progressInterface,
           reportFinishedRange,
           scene,prims.data(),pinfo,settings);
        
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        
        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.share(prims);
        
        /* clear temporary data for static geometry */
        if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }